

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_request.hpp
# Opt level: O1

content_type __thiscall cinatra::coro_http_request::get_content_type(coro_http_request *this)

{
  bool bVar1;
  content_type cVar2;
  size_type sVar3;
  string_view key;
  string_view content_type;
  string_view local_18;
  
  bVar1 = http_parser::is_chunked(this->parser_);
  cVar2 = chunked;
  if (!bVar1) {
    key._M_str = "content-type";
    key._M_len = 0xc;
    local_18 = get_header_value(this,key);
    if (local_18._M_len == 0) {
      cVar2 = unknown - this->is_websocket_;
    }
    else {
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        (&local_18,"application/x-www-form-urlencoded",0,0x21);
      cVar2 = urlencoded;
      if (sVar3 == 0xffffffffffffffff) {
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                          (&local_18,"multipart/form-data",0,0x13);
        cVar2 = multipart;
        if (sVar3 == 0xffffffffffffffff) {
          sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                            (&local_18,"application/octet-stream",0,0x18);
          cVar2 = (uint)(sVar3 != 0xffffffffffffffff) << 2;
        }
      }
    }
  }
  return cVar2;
}

Assistant:

content_type get_content_type() {
    if (is_chunked())
      return content_type::chunked;

    auto content_type = get_header_value("content-type");
    if (!content_type.empty()) {
      if (content_type.find("application/x-www-form-urlencoded") !=
          std::string_view::npos) {
        return content_type::urlencoded;
      }
      else if (content_type.find("multipart/form-data") !=
               std::string_view::npos) {
        return content_type::multipart;
      }
      else if (content_type.find("application/octet-stream") !=
               std::string_view::npos) {
        return content_type::octet_stream;
      }
      else {
        return content_type::string;
      }
    }

    if (is_websocket_) {
      return content_type::websocket;
    }

    return content_type::unknown;
  }